

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  int iVar1;
  void *local_50;
  void *ndata;
  secp256k1_nonce_function_hardened noncefp;
  secp256k1_schnorrsig_extraparams *extraparams_local;
  secp256k1_keypair *keypair_local;
  size_t msglen_local;
  uchar *msg_local;
  uchar *sig64_local;
  secp256k1_context *ctx_local;
  
  ndata = (void *)0x0;
  local_50 = (void *)0x0;
  if (extraparams != (secp256k1_schnorrsig_extraparams *)0x0) {
    iVar1 = secp256k1_memcmp_var(extraparams,schnorrsig_extraparams_magic,4);
    if (iVar1 != 0) {
      secp256k1_callback_call
                (&ctx->illegal_callback,
                 "secp256k1_memcmp_var(extraparams->magic, schnorrsig_extraparams_magic, sizeof(extraparams->magic)) == 0"
                );
      return 0;
    }
    ndata = extraparams->noncefp;
    local_50 = extraparams->ndata;
  }
  iVar1 = secp256k1_schnorrsig_sign_internal
                    (ctx,sig64,msg,msglen,keypair,(secp256k1_nonce_function_hardened)ndata,local_50)
  ;
  return iVar1;
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}